

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-sve.c
# Opt level: O0

_Bool trans_FADDA(DisasContext_conflict1 *s,arg_rprr_esz *a)

{
  TCGContext_conflict1 *tcg_ctx_00;
  _Bool _Var1;
  uint32_t uVar2;
  int iVar3;
  TCGv_i64 v;
  TCGv_ptr r;
  TCGv_ptr r_00;
  TCGv_ptr pTVar4;
  TCGv_i32 arg;
  TCGv_i32 t_desc;
  TCGv_i64 t_val;
  TCGv_ptr t_fpst;
  TCGv_ptr t_pg;
  TCGv_ptr t_rm;
  uint vsz;
  TCGContext_conflict1 *tcg_ctx;
  arg_rprr_esz *a_local;
  DisasContext_conflict1 *s_local;
  
  tcg_ctx_00 = s->uc->tcg_ctx;
  uVar2 = vec_full_reg_size(s);
  if (a->esz == 0) {
    s_local._7_1_ = false;
  }
  else {
    _Var1 = sve_access_check_aarch64(s);
    if (_Var1) {
      pTVar4 = tcg_ctx_00->cpu_env;
      iVar3 = vec_reg_offset(s,a->rn,0,a->esz);
      v = load_esz(tcg_ctx_00,pTVar4,iVar3,a->esz);
      r = tcg_temp_new_ptr(tcg_ctx_00);
      r_00 = tcg_temp_new_ptr(tcg_ctx_00);
      pTVar4 = tcg_ctx_00->cpu_env;
      iVar3 = vec_full_reg_offset(s,a->rm);
      tcg_gen_addi_ptr(tcg_ctx_00,r,pTVar4,(long)iVar3);
      pTVar4 = tcg_ctx_00->cpu_env;
      iVar3 = pred_full_reg_offset(s,a->pg);
      tcg_gen_addi_ptr(tcg_ctx_00,r_00,pTVar4,(long)iVar3);
      pTVar4 = get_fpstatus_ptr_aarch64(tcg_ctx_00,a->esz == 1);
      uVar2 = simd_desc_aarch64(uVar2,uVar2,0);
      arg = tcg_const_i32_aarch64(tcg_ctx_00,uVar2);
      (*trans_FADDA::fns[a->esz + -1])(tcg_ctx_00,v,v,r,r_00,pTVar4,arg);
      tcg_temp_free_i32(tcg_ctx_00,arg);
      tcg_temp_free_ptr(tcg_ctx_00,pTVar4);
      tcg_temp_free_ptr(tcg_ctx_00,r_00);
      tcg_temp_free_ptr(tcg_ctx_00,r);
      write_fp_dreg_aarch64(s,a->rd,v);
      tcg_temp_free_i64(tcg_ctx_00,v);
      s_local._7_1_ = true;
    }
    else {
      s_local._7_1_ = true;
    }
  }
  return s_local._7_1_;
}

Assistant:

static bool trans_FADDA(DisasContext *s, arg_rprr_esz *a)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    typedef void fadda_fn(TCGContext *, TCGv_i64, TCGv_i64, TCGv_ptr,
                          TCGv_ptr, TCGv_ptr, TCGv_i32);
    static fadda_fn * const fns[3] = {
        gen_helper_sve_fadda_h,
        gen_helper_sve_fadda_s,
        gen_helper_sve_fadda_d,
    };
    unsigned vsz = vec_full_reg_size(s);
    TCGv_ptr t_rm, t_pg, t_fpst;
    TCGv_i64 t_val;
    TCGv_i32 t_desc;

    if (a->esz == 0) {
        return false;
    }
    if (!sve_access_check(s)) {
        return true;
    }

    t_val = load_esz(tcg_ctx, tcg_ctx->cpu_env, vec_reg_offset(s, a->rn, 0, a->esz), a->esz);
    t_rm = tcg_temp_new_ptr(tcg_ctx);
    t_pg = tcg_temp_new_ptr(tcg_ctx);
    tcg_gen_addi_ptr(tcg_ctx, t_rm, tcg_ctx->cpu_env, vec_full_reg_offset(s, a->rm));
    tcg_gen_addi_ptr(tcg_ctx, t_pg, tcg_ctx->cpu_env, pred_full_reg_offset(s, a->pg));
    t_fpst = get_fpstatus_ptr(tcg_ctx, a->esz == MO_16);
    t_desc = tcg_const_i32(tcg_ctx, simd_desc(vsz, vsz, 0));

    fns[a->esz - 1](tcg_ctx,t_val, t_val, t_rm, t_pg, t_fpst, t_desc);

    tcg_temp_free_i32(tcg_ctx, t_desc);
    tcg_temp_free_ptr(tcg_ctx, t_fpst);
    tcg_temp_free_ptr(tcg_ctx, t_pg);
    tcg_temp_free_ptr(tcg_ctx, t_rm);

    write_fp_dreg(s, a->rd, t_val);
    tcg_temp_free_i64(tcg_ctx, t_val);
    return true;
}